

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QByteArray * __thiscall
QStringBuilderBase<QStringBuilder<QString_&,_QLatin1String>,_QString>::toLatin1
          (QByteArray *__return_storage_ptr__,
          QStringBuilderBase<QStringBuilder<QString_&,_QLatin1String>,_QString> *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
            ((QString *)&local_30,(QStringBuilder<QString_&,_QLatin1String> *)this);
  QString::toLatin1_helper_inplace((QString *)__return_storage_ptr__);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray toLatin1() const { return this->resolved().toLatin1(); }